

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14803::TestCheckCloseFailureIncludesCheckExpectedAndActual::RunImpl
          (TestCheckCloseFailureIncludesCheckExpectedAndActual *this)

{
  TestResults *pTVar1;
  char *pcVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  float actual;
  float expected;
  TestResults results;
  RecordingReporter reporter;
  float local_884;
  float local_880;
  float local_87c;
  TestDetails local_878;
  TestResults local_858;
  TestReporter local_840;
  undefined4 local_838;
  undefined1 local_834;
  undefined1 local_734;
  undefined4 local_634;
  undefined1 local_630;
  undefined4 local_530;
  undefined1 local_52c;
  undefined1 local_42c;
  char local_32c [256];
  undefined4 local_22c;
  undefined1 local_228;
  undefined1 local_128;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  local_840._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_838 = 0;
  local_634 = 0;
  local_530 = 0;
  local_22c = 0;
  local_834 = 0;
  local_734 = 0;
  local_630 = 0;
  local_52c = 0;
  local_42c = 0;
  local_32c[0] = '\0';
  local_228 = 0;
  local_128 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  UnitTest::TestResults::TestResults(&local_858,&local_840);
  local_87c = 0.9;
  local_880 = 1.1;
  local_884 = 0.01;
  UnitTest::TestDetails::TestDetails(&local_878,"","","",0);
  UnitTest::CheckClose<float,float,float>(&local_858,&local_87c,&local_880,&local_884,&local_878);
  pcVar2 = strstr(local_32c,"xpected 0.9");
  if (pcVar2 == (char *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_878,*ppTVar4,0x9b);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_878,"strstr(reporter.lastFailedMessage, \"xpected 0.9\")");
  }
  pcVar2 = strstr(local_32c,"was 1.1");
  if (pcVar2 == (char *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_878,*ppTVar4,0x9c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_878,"strstr(reporter.lastFailedMessage, \"was 1.1\")");
  }
  UnitTest::TestReporter::~TestReporter(&local_840);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}